

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O0

void __thiscall Wave::set(Wave *this,uint index,uint pattern,bool value)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  uchar *puVar4;
  byte *pbVar5;
  const_reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar9;
  bool old_value;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  Array2D<unsigned_char> *in_stack_ffffffffffffffb0;
  value_type vVar10;
  
  bVar3 = in_CL & 1;
  puVar4 = Array2D<unsigned_char>::get
                     (in_stack_ffffffffffffffb0,
                      CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x10f37b);
  if ((*puVar4 != '\0') != (bool)bVar3) {
    pbVar5 = Array2D<unsigned_char>::get
                       (in_stack_ffffffffffffffb0,
                        CONCAT17(in_CL,in_stack_ffffffffffffffa8) & 0x1ffffffffffffff,0x10f3ca);
    *pbVar5 = bVar3;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 1,(ulong)in_EDX);
    vVar10 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    *pvVar7 = *pvVar7 - vVar10;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(ulong)in_EDX);
    dVar9 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    *pvVar7 = *pvVar7 - dVar9;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    dVar9 = log(*pvVar7);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    *pvVar7 = dVar9;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &in_RDI[5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    *pvVar8 = *pvVar8 - 1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    dVar9 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    dVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    dVar2 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    *pvVar7 = dVar9 - dVar1 / dVar2;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &in_RDI[5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)in_ESI);
    if (*pvVar8 == 0) {
      *(undefined1 *)
       &in_RDI[7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = 1;
    }
  }
  return;
}

Assistant:

void Wave::set(unsigned index, unsigned pattern, bool value) noexcept {
  bool old_value = data.get(index, pattern);
  // If the value isn't changed, nothing needs to be done.
  if (old_value == value) {
    return;
  }
  // Otherwise, the memoisation should be updated.
  data.get(index, pattern) = value;
  memoisation.plogp_sum[index] -= plogp_patterns_frequencies[pattern];
  memoisation.sum[index] -= patterns_frequencies[pattern];
  memoisation.log_sum[index] = log(memoisation.sum[index]);
  memoisation.nb_patterns[index]--;
  memoisation.entropy[index] =
    memoisation.log_sum[index] -
    memoisation.plogp_sum[index] / memoisation.sum[index];
  // If there is no patterns possible in the cell, then there is a
  // contradiction.
  if (memoisation.nb_patterns[index] == 0) {
    is_impossible = true;
  }
}